

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.c
# Opt level: O0

void solver_debug_check_clauses(solver_t *s)

{
  vec_uint_t *p;
  FILE *__stream;
  uint uVar1;
  clause_conflict *clause_00;
  clause_conflict *clause;
  uint local_18;
  uint j;
  uint i;
  uint cref;
  solver_t *s_local;
  
  __stream = _stdout;
  uVar1 = vec_uint_size(s->originals);
  fprintf(__stream,"[Satoko] Checking clauses (%d)...\n",(ulong)uVar1);
  local_18 = 0;
  do {
    uVar1 = vec_uint_size(s->originals);
    if (uVar1 <= local_18) {
      fprintf(_stdout,"[Satoko] All SAT - OK\n");
      return;
    }
    uVar1 = vec_uint_at(s->originals,local_18);
    clause_00 = clause_fetch(s,uVar1);
    for (clause._4_4_ = 0; clause._4_4_ < clause_00->size; clause._4_4_ = clause._4_4_ + 1) {
      p = s->trail;
      uVar1 = lit_compl(*(uint *)(&clause_00[1].field_0x0 + (ulong)clause._4_4_ * 4));
      uVar1 = vec_uint_find(p,uVar1);
      if (uVar1 == 0) break;
    }
    if (clause._4_4_ == clause_00->size) {
      vec_uint_print(s->trail);
      fprintf(_stdout,"[Satoko] FOUND UNSAT CLAUSE]: (%d) ",(ulong)local_18);
      clause_print(clause_00);
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/solver.c"
                    ,0x2e7,"void solver_debug_check_clauses(solver_t *)");
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

void solver_debug_check_clauses(solver_t *s)
{
    unsigned cref, i;

    fprintf(stdout, "[Satoko] Checking clauses (%d)...\n", vec_uint_size(s->originals));
    vec_uint_foreach(s->originals, cref, i) {
        unsigned j;
        struct clause *clause = clause_fetch(s, cref);
        for (j = 0; j < clause->size; j++) {
            if (vec_uint_find(s->trail, lit_compl(clause->data[j].lit))) {
                continue;
            }
            break;
        }
        if (j == clause->size) {
            vec_uint_print(s->trail);
            fprintf(stdout, "[Satoko] FOUND UNSAT CLAUSE]: (%d) ", i);
            clause_print(clause);
            assert(0);
        }
    }
    fprintf(stdout, "[Satoko] All SAT - OK\n");
}